

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

char * uv__unknown_err_code(int err)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char buf [32];
  char acStack_38 [32];
  
  snprintf(acStack_38,0x20,"Unknown system error %d",err);
  sVar1 = strlen(acStack_38);
  pcVar2 = (char *)(*(code *)uv__allocator_0)(sVar1 + 1);
  pcVar3 = (char *)0x0;
  if (pcVar2 != (char *)0x0) {
    memcpy(pcVar2,acStack_38,sVar1 + 1);
    pcVar3 = pcVar2;
  }
  pcVar2 = "Unknown system error";
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

static const char* uv__unknown_err_code(int err) {
  char buf[32];
  char* copy;

  snprintf(buf, sizeof(buf), "Unknown system error %d", err);
  copy = uv__strdup(buf);

  return copy != NULL ? copy : "Unknown system error";
}